

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O0

aom_codec_err_t
aom_codec_dec_init_ver
          (aom_codec_ctx_t *ctx,aom_codec_iface_t *iface,aom_codec_dec_cfg_t *cfg,
          aom_codec_flags_t flags,int ver)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  aom_codec_err_t res;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 local_30;
  aom_codec_err_t local_28;
  
  if (in_R8D == 0x16) {
    if ((in_RDI == (undefined8 *)0x0) || (in_RSI == (undefined8 *)0x0)) {
      local_28 = AOM_CODEC_INVALID_PARAM;
    }
    else if (*(int *)(in_RSI + 1) == 7) {
      if ((in_RSI[2] & 1) == 0) {
        local_28 = AOM_CODEC_INCAPABLE;
      }
      else {
        memset(in_RDI,0,0x38);
        in_RDI[1] = in_RSI;
        *in_RDI = *in_RSI;
        in_RDI[6] = 0;
        in_RDI[4] = in_RCX;
        in_RDI[5] = in_RDX;
        local_28 = (**(code **)(in_RDI[1] + 0x18))(in_RDI);
        if (local_28 != AOM_CODEC_OK) {
          if (in_RDI[6] == 0) {
            local_30 = 0;
          }
          else {
            local_30 = *(undefined8 *)in_RDI[6];
          }
          in_RDI[3] = local_30;
          aom_codec_destroy((aom_codec_ctx_t *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
      }
    }
    else {
      local_28 = AOM_CODEC_ABI_MISMATCH;
    }
  }
  else {
    local_28 = AOM_CODEC_ABI_MISMATCH;
  }
  if (in_RDI != (undefined8 *)0x0) {
    *(aom_codec_err_t *)(in_RDI + 2) = local_28;
  }
  return local_28;
}

Assistant:

aom_codec_err_t aom_codec_dec_init_ver(aom_codec_ctx_t *ctx,
                                       aom_codec_iface_t *iface,
                                       const aom_codec_dec_cfg_t *cfg,
                                       aom_codec_flags_t flags, int ver) {
  aom_codec_err_t res;

  if (ver != AOM_DECODER_ABI_VERSION)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!ctx || !iface)
    res = AOM_CODEC_INVALID_PARAM;
  else if (iface->abi_version != AOM_CODEC_INTERNAL_ABI_VERSION)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!(iface->caps & AOM_CODEC_CAP_DECODER))
    res = AOM_CODEC_INCAPABLE;
  else {
    memset(ctx, 0, sizeof(*ctx));
    ctx->iface = iface;
    ctx->name = iface->name;
    ctx->priv = NULL;
    ctx->init_flags = flags;
    ctx->config.dec = cfg;

    res = ctx->iface->init(ctx);
    if (res) {
      ctx->err_detail = ctx->priv ? ctx->priv->err_detail : NULL;
      aom_codec_destroy(ctx);
    }
  }

  return SAVE_STATUS(ctx, res);
}